

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsHovered(ImRect *bb,ImGuiID id,bool flatten_childs)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if (((((GImGui->HoveredId == id || GImGui->HoveredId == 0) ||
        (GImGui->HoveredIdAllowOverlap == true)) &&
       ((GImGui->HoveredWindow == GImGui->CurrentWindow ||
        ((flatten_childs && (GImGui->HoveredRootWindow == GImGui->CurrentWindow->RootWindow)))))) &&
      ((GImGui->ActiveId == id || GImGui->ActiveId == 0 || (GImGui->ActiveIdAllowOverlap == true))))
     && ((bVar2 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar2 &&
         (bVar2 = IsWindowContentHoverable(pIVar1->HoveredRootWindow), bVar2)))) {
    return true;
  }
  return false;
}

Assistant:

bool ImGui::IsHovered(const ImRect& bb, ImGuiID id, bool flatten_childs)
{
    ImGuiContext& g = *GImGui;
    if (g.HoveredId == 0 || g.HoveredId == id || g.HoveredIdAllowOverlap)
    {
        ImGuiWindow* window = GetCurrentWindowRead();
        if (g.HoveredWindow == window || (flatten_childs && g.HoveredRootWindow == window->RootWindow))
            if ((g.ActiveId == 0 || g.ActiveId == id || g.ActiveIdAllowOverlap) && IsMouseHoveringRect(bb.Min, bb.Max))
                if (IsWindowContentHoverable(g.HoveredRootWindow))
                    return true;
    }
    return false;
}